

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cc
# Opt level: O3

YY_BUFFER_STATE yy_scan_buffer(char *base,yy_size_t size)

{
  YY_BUFFER_STATE new_buffer;
  int iVar1;
  
  if (((size < 2) || (base[size - 2] != '\0')) || (base[size - 1] != '\0')) {
    new_buffer = (YY_BUFFER_STATE)0x0;
  }
  else {
    new_buffer = (YY_BUFFER_STATE)malloc(0x40);
    if (new_buffer == (YY_BUFFER_STATE)0x0) {
      my_fatal_error("out of dynamic memory in yy_scan_buffer()");
    }
    iVar1 = (int)size + -2;
    new_buffer->yy_buf_size = iVar1;
    new_buffer->yy_ch_buf = base;
    new_buffer->yy_buf_pos = base;
    new_buffer->yy_is_our_buffer = 0;
    new_buffer->yy_input_file = (FILE *)0x0;
    new_buffer->yy_n_chars = iVar1;
    new_buffer->yy_is_interactive = 0;
    new_buffer->yy_at_bol = 1;
    new_buffer->yy_fill_buffer = 0;
    new_buffer->yy_buffer_status = 0;
    yy_switch_to_buffer(new_buffer);
  }
  return new_buffer;
}

Assistant:

YY_BUFFER_STATE yy_scan_buffer  (char * base, yy_size_t  size )
{
	YY_BUFFER_STATE b;
    
	if ( size < 2 ||
	     base[size-2] != YY_END_OF_BUFFER_CHAR ||
	     base[size-1] != YY_END_OF_BUFFER_CHAR )
		/* They forgot to leave room for the EOB's. */
		return NULL;

	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state )  );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_buffer()" );

	b->yy_buf_size = (int) (size - 2);	/* "- 2" to take care of EOB's */
	b->yy_buf_pos = b->yy_ch_buf = base;
	b->yy_is_our_buffer = 0;
	b->yy_input_file = NULL;
	b->yy_n_chars = b->yy_buf_size;
	b->yy_is_interactive = 0;
	b->yy_at_bol = 1;
	b->yy_fill_buffer = 0;
	b->yy_buffer_status = YY_BUFFER_NEW;

	yy_switch_to_buffer( b  );

	return b;
}